

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_unnest.cpp
# Opt level: O3

void __thiscall
duckdb::UnnestOperatorState::PrepareInput
          (UnnestOperatorState *this,DataChunk *input,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *select_list)

{
  unsafe_vector<idx_t> *this_00;
  DataChunk *this_01;
  pointer puVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  unsigned_long *puVar4;
  bool bVar5;
  reference this_02;
  reference pvVar6;
  UnifiedVectorFormat *format;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_type __n;
  size_type __n_00;
  value_type *child_vector;
  LogicalType local_48;
  
  this_01 = &this->list_data;
  DataChunk::Reset(this_01);
  ExpressionExecutor::Execute(&this->executor,input,this_01);
  DataChunk::Verify(this_01);
  if ((this->list_data).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->list_data).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n_00 = 0;
    do {
      this_02 = vector<duckdb::Vector,_true>::operator[](&this_01->data,__n_00);
      iVar7 = (this->list_data).count;
      pvVar6 = vector<duckdb::UnifiedVectorFormat,_true>::operator[](&this->list_vector_data,__n_00)
      ;
      Vector::ToUnifiedFormat(this_02,iVar7,pvVar6);
      LogicalType::LogicalType(&local_48,SQLNULL);
      bVar5 = LogicalType::operator==(&this_02->type,&local_48);
      LogicalType::~LogicalType(&local_48);
      if (bVar5) {
        format = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                           (&this->list_child_data,__n_00);
        iVar7 = 0;
      }
      else {
        iVar7 = ListVector::GetListSize(this_02);
        this_02 = ListVector::GetEntry(this_02);
        format = vector<duckdb::UnifiedVectorFormat,_true>::operator[]
                           (&this->list_child_data,__n_00);
      }
      Vector::ToUnifiedFormat(this_02,iVar7,format);
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)(((long)(this->list_data).data.
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->list_data).data.
                                     super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                     super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             0x4ec4ec4ec4ec4ec5));
  }
  uVar8 = (this->list_data).count;
  this_00 = &this->unnest_lengths;
  if ((ulong)((long)(this->unnest_lengths).
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->unnest_lengths).
                    super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) < uVar8) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,uVar8);
    uVar8 = (this->list_data).count;
  }
  if (uVar8 != 0) {
    puVar1 = (this_00->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      puVar1[uVar8] = 0;
      uVar8 = uVar8 + 1;
    } while (uVar8 < (this->list_data).count);
  }
  if ((this->list_data).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->list_data).data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar6 = vector<duckdb::UnifiedVectorFormat,_true>::operator[](&this->list_vector_data,__n);
      uVar8 = (this->list_data).count;
      if (uVar8 != 0) {
        pdVar2 = pvVar6->data;
        psVar3 = pvVar6->sel->sel_vector;
        puVar4 = (pvVar6->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        puVar1 = (this_00->super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar9 = 0;
        do {
          uVar10 = uVar9;
          if (psVar3 != (sel_t *)0x0) {
            uVar10 = (ulong)psVar3[uVar9];
          }
          if (((puVar4 == (unsigned_long *)0x0) ||
              ((puVar4[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)) &&
             (puVar1[uVar9] < *(ulong *)(pdVar2 + uVar10 * 0x10 + 8))) {
            puVar1[uVar9] = *(ulong *)(pdVar2 + uVar10 * 0x10 + 8);
            uVar8 = (this->list_data).count;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < uVar8);
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(this->list_data).data.
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->list_data).data.
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  this->first_fetch = false;
  return;
}

Assistant:

void UnnestOperatorState::PrepareInput(DataChunk &input, const vector<unique_ptr<Expression>> &select_list) {
	list_data.Reset();
	// execute the expressions inside each UNNEST in the select_list to get the list data
	// execution results (lists) are kept in list_data chunk
	executor.Execute(input, list_data);

	// verify incoming lists
	list_data.Verify();
	D_ASSERT(input.size() == list_data.size());
	D_ASSERT(list_data.ColumnCount() == select_list.size());
	D_ASSERT(list_vector_data.size() == list_data.ColumnCount());
	D_ASSERT(list_child_data.size() == list_data.ColumnCount());

	// get the UnifiedVectorFormat of each list_data vector (LIST vectors for the different UNNESTs)
	// both for the vector itself and its child vector
	for (idx_t col_idx = 0; col_idx < list_data.ColumnCount(); col_idx++) {
		auto &list_vector = list_data.data[col_idx];
		list_vector.ToUnifiedFormat(list_data.size(), list_vector_data[col_idx]);

		if (list_vector.GetType() == LogicalType::SQLNULL) {
			// UNNEST(NULL): SQLNULL vectors don't have child vectors, but we need to point to the child vector of
			// each vector, so we just get the UnifiedVectorFormat of the vector itself
			auto &child_vector = list_vector;
			child_vector.ToUnifiedFormat(0, list_child_data[col_idx]);
		} else {
			auto list_size = ListVector::GetListSize(list_vector);
			auto &child_vector = ListVector::GetEntry(list_vector);
			child_vector.ToUnifiedFormat(list_size, list_child_data[col_idx]);
		}
	}
	// get the unnest lengths
	if (list_data.size() > unnest_lengths.size()) {
		unnest_lengths.resize(list_data.size());
	}
	for (idx_t r = 0; r < list_data.size(); r++) {
		unnest_lengths[r] = 0;
	}
	for (idx_t col_idx = 0; col_idx < list_data.ColumnCount(); col_idx++) {
		auto &vector_data = list_vector_data[col_idx];
		for (idx_t r = 0; r < list_data.size(); r++) {
			auto current_idx = vector_data.sel->get_index(r);
			if (!vector_data.validity.RowIsValid(current_idx)) {
				continue;
			}
			// check if this list is longer than the current unnest length
			auto list_data_entries = UnifiedVectorFormat::GetData<list_entry_t>(vector_data);
			auto list_entry = list_data_entries[current_idx];
			if (list_entry.length > unnest_lengths[r]) {
				unnest_lengths[r] = list_entry.length;
			}
		}
	}

	first_fetch = false;
}